

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O3

void __thiscall
llvm::cl::opt<(anonymous_namespace)::HelpPrinter,_true,_llvm::cl::parser<bool>_>::printOptionValue
          (opt<(anonymous_namespace)::HelpPrinter,_true,_llvm::cl::parser<bool>_> *this,
          size_t GlobalWidth,bool Force)

{
  HelpPrinter *pHVar1;
  undefined7 in_register_00000011;
  
  pHVar1 = (this->super_opt_storage<(anonymous_namespace)::HelpPrinter,_true,_true>).Location;
  if ((int)CONCAT71(in_register_00000011,Force) == 0) {
    if (pHVar1 != (HelpPrinter *)0x0) {
      return;
    }
  }
  else if (pHVar1 != (HelpPrinter *)0x0) {
    basic_parser_impl::printOptionNoValue((basic_parser_impl *)this,&this->super_Option,GlobalWidth)
    ;
    return;
  }
  __assert_fail("Location && \"cl::location(...) not specified for a command \" \"line option with external storage, \" \"or cl::init specified before cl::location()!!\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/CommandLine.h"
                ,0x4ad,
                "void llvm::cl::opt_storage<(anonymous namespace)::HelpPrinter, true, true>::check_location() const [DataType = (anonymous namespace)::HelpPrinter, ExternalStorage = true, isClass = true]"
               );
}

Assistant:

void printOptionValue(size_t GlobalWidth, bool Force) const override {
    if (Force || this->getDefault().compare(this->getValue())) {
      cl::printOptionDiff<ParserClass>(*this, Parser, this->getValue(),
                                       this->getDefault(), GlobalWidth);
    }
  }